

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

bool __thiscall
HighsDomain::ConflictSet::resolveLinearLeq
          (ConflictSet *this,HighsCDouble M,double Mlower,double *vals)

{
  pointer *ppLVar1;
  double *pdVar2;
  pointer pHVar3;
  pointer pLVar4;
  iterator __position;
  HighsDomain *pHVar5;
  HighsMipSolver *pHVar6;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var7;
  pointer pHVar8;
  pointer ppVar9;
  undefined8 uVar10;
  bool bVar11;
  char cVar12;
  uint uVar13;
  pointer pRVar14;
  int iVar15;
  ulong uVar16;
  size_type __new_size;
  long lVar17;
  long lVar18;
  double dVar19;
  ulong in_XMM2_Qb;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  LocalDomChg locdomchg;
  double ub;
  LocalDomChg local_c8;
  ulong local_a8;
  undefined8 local_a0;
  double local_98;
  double local_80;
  vector<HighsDomain::ConflictSet::LocalDomChg,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
  *local_78;
  double *local_70;
  long local_68;
  long local_60;
  pointer local_58;
  double local_50;
  double local_48;
  ulong uStack_40;
  
  dVar19 = M.lo;
  local_a0._0_4_ = M.hi._0_4_;
  local_a0._4_4_ = M.hi._4_4_;
  pLVar4 = (this->resolvedDomainChanges).
           super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->resolvedDomainChanges).
      super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
      ._M_impl.super__Vector_impl_data._M_finish != pLVar4) {
    (this->resolvedDomainChanges).
    super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar4;
  }
  local_48 = -Mlower;
  uStack_40 = in_XMM2_Qb ^ 0x8000000000000000;
  dVar23 = M.hi;
  dVar21 = dVar23 - Mlower;
  dVar21 = (local_48 - (dVar21 - dVar23)) + (dVar23 - (dVar21 - (dVar21 - dVar23))) + dVar19 +
           dVar21;
  bVar11 = true;
  if (dVar21 < 0.0) {
    local_78 = (vector<HighsDomain::ConflictSet::LocalDomChg,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
                *)&this->resolvedDomainChanges;
    pRVar14 = (this->resolveBuffer).
              super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_98 = Mlower;
    local_70 = vals;
    if (0 < (int)((ulong)((long)(this->resolveBuffer).
                                super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar14) >> 5)) {
      lVar18 = 0;
      lVar17 = 0;
      do {
        iVar15 = *(int *)((long)&pRVar14->boundPos + lVar18);
        local_c8.pos = iVar15;
        pHVar3 = (this->localdom->domchgstack_).
                 super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar15;
        local_c8.domchg.boundval = pHVar3->boundval;
        local_c8.domchg.column = pHVar3->column;
        local_c8.domchg.boundtype = pHVar3->boundtype;
        dVar21 = *(double *)((long)&pRVar14->delta + lVar18);
        __position._M_current =
             (this->resolvedDomainChanges).
             super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->resolvedDomainChanges).
            super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<HighsDomain::ConflictSet::LocalDomChg,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
          ::_M_realloc_insert<HighsDomain::ConflictSet::LocalDomChg_const&>
                    (local_78,__position,&local_c8);
          Mlower = local_98;
        }
        else {
          ((__position._M_current)->domchg).column = local_c8.domchg.column;
          ((__position._M_current)->domchg).boundtype = local_c8.domchg.boundtype;
          (__position._M_current)->pos = iVar15;
          *(undefined4 *)&(__position._M_current)->field_0x4 = local_c8._4_4_;
          ((__position._M_current)->domchg).boundval = local_c8.domchg.boundval;
          ppLVar1 = &(this->resolvedDomainChanges).
                     super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppLVar1 = *ppLVar1 + 1;
        }
        dVar23 = (double)CONCAT44(local_a0._4_4_,(undefined4)local_a0) + dVar21;
        dVar19 = dVar19 + ((double)CONCAT44(local_a0._4_4_,(undefined4)local_a0) - (dVar23 - dVar21)
                          ) + (dVar21 - (dVar23 - (dVar23 - dVar21)));
        dVar21 = dVar23 - Mlower;
        dVar21 = (local_48 - (dVar21 - dVar23)) + (dVar23 - (dVar21 - (dVar21 - dVar23))) + dVar19 +
                 dVar21;
        if (0.0 <= dVar21) break;
        lVar17 = lVar17 + 1;
        pRVar14 = (this->resolveBuffer).
                  super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar18 = lVar18 + 0x20;
        local_a0._0_4_ = SUB84(dVar23,0);
        local_a0._4_4_ = (undefined4)((ulong)dVar23 >> 0x20);
      } while (lVar17 < (int)((ulong)((long)(this->resolveBuffer).
                                            super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pRVar14) >> 5));
    }
    if (0.0 <= dVar21) {
      pdVar2 = &((this->localdom->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
      if ((*pdVar2 <= dVar21 && dVar21 != *pdVar2) &&
         (uVar13 = (int)((ulong)((long)(this->resolvedDomainChanges).
                                       super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->resolvedDomainChanges).
                                      super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555
                   - 1, -1 < (int)uVar13)) {
        uVar16 = (ulong)uVar13;
        do {
          pRVar14 = (this->resolveBuffer).
                    super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_58 = pRVar14 + uVar16;
          local_68 = uVar16 * 3;
          pLVar4 = (this->resolvedDomainChanges).
                   super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar16;
          local_60 = (long)pRVar14[uVar16].valuePos;
          iVar15 = (pLVar4->domchg).column;
          local_50 = (pLVar4->domchg).boundval;
          local_a0 = pRVar14[uVar16].baseBound;
          dVar21 = dVar23 - pRVar14[uVar16].delta;
          local_c8._0_8_ = Mlower - dVar21;
          local_c8.domchg.boundval =
               ((Mlower - (dVar21 + (double)local_c8._0_8_)) +
               (-dVar21 - ((double)local_c8._0_8_ - (dVar21 + (double)local_c8._0_8_)))) -
               ((-pRVar14[uVar16].delta - (dVar21 - dVar23)) +
                (dVar23 - (dVar21 - (dVar21 - dVar23))) + dVar19);
          local_a8 = uVar16;
          if ((pLVar4->domchg).boundtype == kLower) {
            HighsCDouble::operator/=((HighsCDouble *)&local_c8,local_70[local_60]);
            local_80 = local_a0 + (double)local_c8._0_8_;
            local_80 = (local_a0 - (local_80 - (double)local_c8._0_8_)) +
                       ((double)local_c8._0_8_ - (local_80 - (local_80 - (double)local_c8._0_8_))) +
                       local_c8.domchg.boundval + local_80;
            pHVar5 = this->localdom;
            pHVar6 = pHVar5->mipsolver;
            _Var7._M_head_impl =
                 (pHVar6->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
            pHVar8 = (pHVar6->model_->integrality_).
                     super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar21 = ceil(local_80);
            dVar20 = local_80;
            if (pHVar8[iVar15] != kContinuous) {
              dVar20 = dVar21;
            }
            dVar21 = dVar20 - local_50;
            if (dVar21 < -(_Var7._M_head_impl)->feastol) {
              (pLVar4->domchg).boundval = dVar20;
              if ((_Var7._M_head_impl)->epsilon < dVar20 - local_a0) {
                ppVar9 = (pHVar5->prevboundval_).
                         super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                lVar17 = (long)pLVar4->pos;
                if (dVar20 <= ppVar9[lVar17].first) {
                  do {
                    iVar15 = ppVar9[lVar17].second;
                    lVar17 = (long)iVar15;
                  } while (dVar20 <= ppVar9[lVar17].first);
                  goto LAB_0029e8e6;
                }
                goto LAB_0029e8e8;
              }
LAB_0029e92e:
              pLVar4 = (this->resolvedDomainChanges).
                       super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              __new_size = (long)(((ulong)((long)(this->resolvedDomainChanges).
                                                 super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)pLVar4) >> 3) * -0x5555555500000000 + -0x100000000)
                           >> 0x20;
              local_c8.domchg.column = pLVar4[__new_size].domchg.column;
              local_c8.domchg.boundtype = pLVar4[__new_size].domchg.boundtype;
              local_c8._0_8_ = *(undefined8 *)(pLVar4 + __new_size);
              local_c8.domchg.boundval = pLVar4[__new_size].domchg.boundval;
              uVar10 = *(undefined8 *)(&(pLVar4->domchg).column + local_68 * 2);
              pLVar4[__new_size].domchg.column = (int)uVar10;
              pLVar4[__new_size].domchg.boundtype = (int)((ulong)uVar10 >> 0x20);
              dVar21 = ((HighsDomainChange *)(&pLVar4->pos + local_68 * 2 + 2))->boundval;
              *(undefined8 *)(pLVar4 + __new_size) = *(undefined8 *)(&pLVar4->pos + local_68 * 2);
              pLVar4[__new_size].domchg.boundval = dVar21;
              *(undefined8 *)(&(pLVar4->domchg).column + local_68 * 2) = local_c8.domchg._8_8_;
              *(undefined8 *)(&pLVar4->pos + local_68 * 2) = local_c8._0_8_;
              ((HighsDomainChange *)(&pLVar4->pos + local_68 * 2 + 2))->boundval =
                   local_c8.domchg.boundval;
              std::
              vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
              ::resize((vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                        *)local_78,__new_size);
              dVar20 = local_58->delta;
              dVar21 = -dVar20;
              dVar22 = dVar23 - dVar20;
              dVar20 = dVar20 + dVar22;
              goto LAB_0029e9d6;
            }
LAB_0029e90c:
            cVar12 = '\a';
            bVar11 = false;
          }
          else {
            HighsCDouble::operator/=((HighsCDouble *)&local_c8,local_70[local_60]);
            local_80 = local_a0 + (double)local_c8._0_8_;
            local_80 = (local_a0 - (local_80 - (double)local_c8._0_8_)) +
                       ((double)local_c8._0_8_ - (local_80 - (local_80 - (double)local_c8._0_8_))) +
                       local_c8.domchg.boundval + local_80;
            pHVar5 = this->localdom;
            pHVar6 = pHVar5->mipsolver;
            _Var7._M_head_impl =
                 (pHVar6->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
            pHVar8 = (pHVar6->model_->integrality_).
                     super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar21 = floor(local_80);
            dVar20 = local_80;
            if (pHVar8[iVar15] != kContinuous) {
              dVar20 = dVar21;
            }
            dVar21 = dVar20 - local_50;
            if (dVar21 <= (_Var7._M_head_impl)->feastol) goto LAB_0029e90c;
            (pLVar4->domchg).boundval = dVar20;
            if (-(_Var7._M_head_impl)->epsilon <= dVar20 - local_a0) goto LAB_0029e92e;
            ppVar9 = (pHVar5->prevboundval_).
                     super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar17 = (long)pLVar4->pos;
            if (ppVar9[lVar17].first <= dVar20) {
              do {
                iVar15 = ppVar9[lVar17].second;
                lVar17 = (long)iVar15;
              } while (ppVar9[lVar17].first <= dVar20);
LAB_0029e8e6:
              pLVar4->pos = iVar15;
            }
LAB_0029e8e8:
            dVar21 = dVar21 * local_70[local_60];
            dVar22 = dVar23 + dVar21;
            dVar20 = dVar22 - dVar21;
LAB_0029e9d6:
            dVar19 = dVar19 + (dVar23 - dVar20) + (dVar21 - (dVar22 - dVar20));
            dVar23 = dVar22 - local_98;
            bVar11 = ((this->localdom->mipsolver->mipdata_)._M_t.
                      super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                      .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol <
                     (local_48 - (dVar23 - dVar22)) + (dVar22 - (dVar23 - (dVar23 - dVar22))) +
                     dVar19 + dVar23;
            cVar12 = !bVar11 * '\x05';
            dVar23 = dVar22;
          }
          if (bVar11) {
            cVar12 = '\0';
          }
        } while (((cVar12 == '\a') || (cVar12 == '\0')) &&
                (uVar16 = local_a8 - 1, Mlower = local_98, 0 < (long)local_a8));
      }
      bVar11 = true;
    }
    else {
      bVar11 = false;
    }
  }
  return bVar11;
}

Assistant:

bool HighsDomain::ConflictSet::resolveLinearLeq(HighsCDouble M, double Mlower,
                                                const double* vals) {
  resolvedDomainChanges.clear();
  double covered = double(M - Mlower);
  if (covered < 0) {
    for (HighsInt k = 0; k < (HighsInt)resolveBuffer.size(); ++k) {
      ResolveCandidate& reasonDomchg = resolveBuffer[k];
      LocalDomChg locdomchg;
      locdomchg.pos = reasonDomchg.boundPos;
      locdomchg.domchg = localdom.domchgstack_[reasonDomchg.boundPos];
      M += reasonDomchg.delta;
      resolvedDomainChanges.push_back(locdomchg);
      assert(resolvedDomainChanges.back().pos >= 0);
      assert(resolvedDomainChanges.back().pos <
             (HighsInt)localdom.domchgstack_.size());
      covered = double(M - Mlower);
      if (covered >= 0) break;
    }

    if (covered < 0) {
      // printf("local bounds reach only value of %.12g, need at least
      // %.12g\n",
      //        M, Mlower);
      return false;
    }

    if (covered > localdom.feastol()) {
      // there is room for relaxing bounds / dropping unneeded bound changes
      // from the explanation
      // HighsInt numRelaxed = 0;
      // HighsInt numDropped = 0;
      for (HighsInt k = resolvedDomainChanges.size() - 1; k >= 0; --k) {
        ResolveCandidate& reasonDomchg = resolveBuffer[k];
        LocalDomChg& locdomchg = resolvedDomainChanges[k];
        HighsInt i = reasonDomchg.valuePos;
        HighsInt col = locdomchg.domchg.column;
        if (locdomchg.domchg.boundtype == HighsBoundType::kLower) {
          double lb = locdomchg.domchg.boundval;
          double glb = reasonDomchg.baseBound;
          double relaxLb =
              double(((Mlower - (M - reasonDomchg.delta)) / vals[i]) + glb);
          if (localdom.mipsolver->variableType(col) !=
              HighsVarType::kContinuous)
            relaxLb = std::ceil(relaxLb);

          if (relaxLb - lb >= -localdom.feastol()) continue;

          locdomchg.domchg.boundval = relaxLb;

          if (relaxLb - glb <= localdom.mipsolver->mipdata_->epsilon) {
            // domain change can be fully removed from conflict
            HighsInt last = resolvedDomainChanges.size() - 1;
            std::swap(resolvedDomainChanges[last], resolvedDomainChanges[k]);
            resolvedDomainChanges.resize(last);

            M -= reasonDomchg.delta;
            // ++numDropped;
          } else {
            // bound can be relaxed
            while (relaxLb <= localdom.prevboundval_[locdomchg.pos].first)
              locdomchg.pos = localdom.prevboundval_[locdomchg.pos].second;

            M += vals[i] * (relaxLb - lb);
            // ++numRelaxed;
          }

          covered = double(M - Mlower);
          if (covered <= localdom.feastol()) break;
        } else {
          double ub = locdomchg.domchg.boundval;
          double gub = reasonDomchg.baseBound;
          double relaxUb =
              double(((Mlower - (M - reasonDomchg.delta)) / vals[i]) + gub);
          if (localdom.mipsolver->variableType(col) !=
              HighsVarType::kContinuous)
            relaxUb = std::floor(relaxUb);

          if (relaxUb - ub <= localdom.feastol()) continue;

          locdomchg.domchg.boundval = relaxUb;

          if (relaxUb - gub >= -localdom.mipsolver->mipdata_->epsilon) {
            // domain change can be fully removed from conflict
            HighsInt last = resolvedDomainChanges.size() - 1;
            std::swap(resolvedDomainChanges[last], resolvedDomainChanges[k]);
            resolvedDomainChanges.resize(last);

            M -= reasonDomchg.delta;
            // ++numDropped;
          } else {
            // bound can be relaxed
            while (relaxUb >= localdom.prevboundval_[locdomchg.pos].first)
              locdomchg.pos = localdom.prevboundval_[locdomchg.pos].second;

            M += vals[i] * (relaxUb - ub);
            // ++numRelaxed;
          }

          covered = double(M - Mlower);
          if (covered <= localdom.feastol()) break;
        }
      }

      // if (numRelaxed + numDropped)
      //   printf("relaxed %d and dropped %d of %d resolved domain changes\n",
      //          (int)numRelaxed, (int)numDropped,
      //          (int)resolvedDomainChanges.size());

      assert(covered >= -localdom.mipsolver->mipdata_->feastol);
    }
  }
  return true;
}